

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

bool __thiscall draco::ObjDecoder::ParseNormal(ObjDecoder *this,Status *status)

{
  DecoderBuffer *buffer;
  long lVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var2;
  size_t __n;
  bool bVar3;
  long lVar4;
  float val [3];
  allocator<char> local_7d;
  float local_7c [3];
  string local_70 [32];
  undefined1 local_50 [40];
  
  lVar1 = (this->buffer_).pos_;
  lVar4 = lVar1 + 2;
  if (((this->buffer_).data_size_ < lVar4) ||
     (buffer = &this->buffer_, *(short *)(buffer->data_ + lVar1) != 0x6e76)) {
    bVar3 = false;
  }
  else {
    (this->buffer_).pos_ = lVar4;
    if (this->counting_mode_ == false) {
      lVar4 = 0;
      do {
        if (lVar4 + 4 == 0x10) {
          _Var2._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               (this->out_point_cloud_->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->norm_att_id_]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          __n = *(size_t *)
                 ((long)_Var2._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
          memcpy((void *)((uint)this->num_normals_ * __n +
                         **(long **)_Var2._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl),local_7c,__n);
          goto LAB_001129d5;
        }
        parser::SkipWhitespace(buffer);
        bVar3 = parser::ParseFloat(buffer,(float *)((long)local_7c + lVar4));
        lVar4 = lVar4 + 4;
      } while (bVar3);
      std::__cxx11::string::string<std::allocator<char>>
                (local_70,"Failed to parse a float number",&local_7d);
      local_50._0_4_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)(local_50 + 8),local_70);
      Status::operator=(status,(Status *)local_50);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      std::__cxx11::string::~string(local_70);
    }
    else {
LAB_001129d5:
      this->num_normals_ = this->num_normals_ + 1;
      parser::SkipLine(buffer);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

Status ObjDecoder::DecodeInternal() {
  // In the first pass, count the number of different elements in the geometry.
  // In case the desired output is just a point cloud (i.e., when
  // out_mesh_ == nullptr) the decoder will ignore all information about the
  // connectivity that may be included in the source data.
  counting_mode_ = true;
  ResetCounters();
  material_name_to_id_.clear();
  last_sub_obj_id_ = 0;
  // Parse all lines.
  Status status(Status::OK);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }

  if (mesh_files_ && !input_file_name_.empty()) {
    mesh_files_->push_back(input_file_name_);
  }

  bool use_identity_mapping = false;
  if (num_obj_faces_ == 0) {
    // Mesh has no faces. In this case we try to read the geometry as a point
    // cloud where every attribute entry is a point.

    // Ensure the number of all entries is same for all attributes.
    if (num_positions_ == 0) {
      return Status(Status::DRACO_ERROR, "No position attribute");
    }
    if (num_tex_coords_ > 0 && num_tex_coords_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of texture coordinates for a point cloud");
    }
    if (num_normals_ > 0 && num_normals_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of normals for a point cloud");
    }

    out_mesh_ = nullptr;  // Treat the output geometry as a point cloud.
    use_identity_mapping = true;
  }

  // Initialize point cloud and mesh properties.
  if (out_mesh_) {
    // Start decoding a mesh with the given number of faces. For point clouds we
    // silently ignore all data about the mesh connectivity.
    out_mesh_->SetNumFaces(num_obj_faces_);
  }
  if (num_obj_faces_ > 0) {
    out_point_cloud_->set_num_points(3 * num_obj_faces_);
  } else {
    out_point_cloud_->set_num_points(num_positions_);
  }

  // Add attributes if they are present in the input data.
  if (num_positions_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    pos_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_positions_);
  }
  if (num_tex_coords_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::TEX_COORD, nullptr, 2, DT_FLOAT32, false,
            sizeof(float) * 2, 0);
    tex_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_tex_coords_);
  }
  if (num_normals_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    norm_att_id_ =
        out_point_cloud_->AddAttribute(va, use_identity_mapping, num_normals_);
  }
  if (preserve_polygons_ && has_polygons_) {
    // Create attribute for polygon reconstruction.
    GeometryAttribute va;
    va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    PointCloud *const pc = out_point_cloud_;
    added_edge_att_id_ = pc->AddAttribute(va, false, 2);

    // Set attribute values to zero and one representing old edge and new edge.
    for (const uint8_t i : {0, 1}) {
      const AttributeValueIndex avi(i);
      pc->attribute(added_edge_att_id_)->SetAttributeValue(avi, &i);
    }

    // Add attribute metadata with name.
    std::unique_ptr<AttributeMetadata> metadata(new draco::AttributeMetadata());
    metadata->AddEntryString("name", "added_edges");
    pc->AddAttributeMetadata(added_edge_att_id_, std::move(metadata));
  }
  if (num_materials_ > 0 && num_obj_faces_ > 0) {
    GeometryAttribute va;
    const auto geometry_attribute_type = GeometryAttribute::GENERIC;
    if (num_materials_ < 256) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (num_materials_ < (1 << 16)) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    material_att_id_ =
        out_point_cloud_->AddAttribute(va, false, num_materials_);

    // Fill the material entries.
    for (int i = 0; i < num_materials_; ++i) {
      const AttributeValueIndex avi(i);
      out_point_cloud_->attribute(material_att_id_)->SetAttributeValue(avi, &i);
    }

    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> material_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      material_metadata->AddEntryString("name", "material");
      // Add all material names.
      for (const auto &itr : material_name_to_id_) {
        material_metadata->AddEntryInt(itr.first, itr.second);
      }
      if (!material_file_name_.empty()) {
        material_metadata->AddEntryString("file_name", material_file_name_);
      }

      out_point_cloud_->AddAttributeMetadata(material_att_id_,
                                             std::move(material_metadata));
    }
  }
  if (!obj_name_to_id_.empty() && num_obj_faces_ > 0) {
    GeometryAttribute va;
    if (obj_name_to_id_.size() < 256) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (obj_name_to_id_.size() < (1 << 16)) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    sub_obj_att_id_ = out_point_cloud_->AddAttribute(
        va, false, static_cast<uint32_t>(obj_name_to_id_.size()));
    // Fill the sub object id entries.
    for (const auto &itr : obj_name_to_id_) {
      const AttributeValueIndex i(itr.second);
      out_point_cloud_->attribute(sub_obj_att_id_)->SetAttributeValue(i, &i);
    }
    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> sub_obj_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      sub_obj_metadata->AddEntryString("name", "sub_obj");
      // Add all sub object names.
      for (const auto &itr : obj_name_to_id_) {
        const AttributeValueIndex i(itr.second);
        sub_obj_metadata->AddEntryInt(itr.first, itr.second);
      }
      out_point_cloud_->AddAttributeMetadata(sub_obj_att_id_,
                                             std::move(sub_obj_metadata));
    }
  }

  // Perform a second iteration of parsing and fill all the data.
  counting_mode_ = false;
  ResetCounters();
  // Start parsing from the beginning of the buffer again.
  buffer()->StartDecodingFrom(0);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }
  if (out_mesh_) {
    // Add faces with identity mapping between vertex and corner indices.
    // Duplicate vertices will get removed later.
    Mesh::Face face;
    for (FaceIndex i(0); i < num_obj_faces_; ++i) {
      for (int c = 0; c < 3; ++c) {
        face[c] = 3 * i.value() + c;
      }
      out_mesh_->SetFace(i, face);
    }
  }

#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  if (deduplicate_input_values_) {
    out_point_cloud_->DeduplicateAttributeValues();
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  out_point_cloud_->DeduplicatePointIds();
#endif
  return status;
}